

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void wasm::(anonymous_namespace)::
     disallowDuplicates<std::vector<unsigned_int,std::allocator<unsigned_int>>>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *targets)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *targets_local;
  
  return;
}

Assistant:

void disallowDuplicates(const T& targets) {
#if defined(POSSIBLE_CONTENTS_DEBUG) && POSSIBLE_CONTENTS_DEBUG >= 2
  std::unordered_set<LocationIndex> uniqueTargets;
  for (const auto& target : targets) {
    uniqueTargets.insert(target);
  }
  assert(uniqueTargets.size() == targets.size());
#endif
}